

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_hishelf2_get_heap_size(ma_hishelf2_config *pConfig,size_t *pHeapSizeInBytes)

{
  ma_result mVar1;
  ulong uVar2;
  double dVar3;
  double __x;
  
  dVar3 = (pConfig->frequency * 6.283185307179586) / (double)pConfig->sampleRate;
  sin(dVar3);
  sin(1.5707963267948966 - dVar3);
  dVar3 = pow(10.0,pConfig->gainDB / 40.0);
  __x = (1.0 / pConfig->shelfSlope + -1.0) * (1.0 / dVar3 + dVar3) + 2.0;
  if (__x < 0.0) {
    sqrt(__x);
  }
  if (dVar3 < 0.0) {
    sqrt(dVar3);
  }
  if (pHeapSizeInBytes == (size_t *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    uVar2 = (ulong)pConfig->channels;
    *pHeapSizeInBytes = 0;
    if (uVar2 == 0) {
      mVar1 = (uint)(uVar2 != 0) * 2 + MA_INVALID_ARGS;
    }
    else {
      *pHeapSizeInBytes = uVar2 << 3;
      mVar1 = MA_SUCCESS;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_hishelf2_get_heap_size(const ma_hishelf2_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_biquad_config bqConfig;
    bqConfig = ma_hishelf2__get_biquad_config(pConfig);

    return ma_biquad_get_heap_size(&bqConfig, pHeapSizeInBytes);
}